

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O1

int Gia_ManFromIfLogicFindLut
              (If_Man_t *pIfMan,Gia_Man_t *pNew,If_Cut_t *pCutBest,sat_solver *pSat,
              Vec_Int_t *vLeaves,Vec_Int_t *vLits,Vec_Int_t *vCover,Vec_Int_t *vMapping,
              Vec_Int_t *vMapping2,Vec_Int_t *vPacking)

{
  word *pwVar1;
  Vec_Mem_t *pVVar2;
  uint uVar3;
  uint uVar4;
  word *pwVar5;
  byte bVar6;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  uint uSet;
  uint uVar10;
  int *piVar11;
  uint uVar12;
  byte *pbVar13;
  ulong uVar14;
  ulong uVar15;
  word uFree;
  word uBound;
  int pVarsS [15];
  int pVarsB [15];
  int pVarsF [15];
  
  iVar7 = *pIfMan->pPars->pLutStruct + -0x30;
  if (iVar7 < vLeaves->nSize) {
    uVar3 = pCutBest->iCutFunc;
    if ((int)uVar3 < 0) {
LAB_006b89c1:
      __assert_fail("pCut->iCutFunc >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/if.h"
                    ,0x1a6,"int If_CutTruthLit(If_Cut_t *)");
    }
    uVar4 = pIfMan->vTtDsds[(byte)pCutBest->field_0x1f]->pArray[uVar3 >> 1];
    if ((int)uVar4 < 0) {
LAB_006b89e0:
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                    ,0x10f,"int Abc_LitNotCond(int, int)");
    }
    uVar3 = If_DsdManSuppSize(pIfMan->pIfDsdMan,uVar4 ^ uVar3 & 1);
    if (uVar3 != (byte)pCutBest->field_0x1f) {
      __assert_fail("If_DsdManSuppSize(pIfMan->pIfDsdMan, If_CutDsdLit(pIfMan, pCutBest)) == (int)pCutBest->nLeaves"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaIf.c"
                    ,0x583,
                    "int Gia_ManFromIfLogicFindLut(If_Man_t *, Gia_Man_t *, If_Cut_t *, sat_solver *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                   );
    }
    if (pIfMan->pPars->fDelayOptLut == 0) {
      uVar3 = pCutBest->iCutFunc;
      if ((int)uVar3 < 0) goto LAB_006b89c1;
      uVar4 = pIfMan->vTtDsds[(byte)pCutBest->field_0x1f]->pArray[uVar3 >> 1];
      if ((int)uVar4 < 0) goto LAB_006b89e0;
      uVar3 = If_DsdManCheckXY(pIfMan->pIfDsdMan,uVar4 ^ uVar3 & 1,iVar7,1,0,1,0);
    }
    else {
      uVar3 = pCutBest->uMaskFunc;
    }
    uVar4 = pCutBest->iCutFunc;
    if (-1 < (int)uVar4) {
      uVar12 = *(uint *)&pCutBest->field_0x1c >> 0x18;
      uVar10 = uVar4 >> 1;
      uVar9 = 6;
      if (6 < uVar12) {
        uVar9 = uVar12;
      }
      if (pIfMan->vTtPerms[uVar12]->nSize <= (int)(uVar9 * uVar10)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecStr.h"
                      ,0x175,"char *Vec_StrEntryP(Vec_Str_t *, int)");
      }
      uSet = 0;
      if (0xffffff < *(uint *)&pCutBest->field_0x1c) {
        pbVar13 = (byte *)(pIfMan->vTtPerms[uVar12]->pArray + uVar9 * uVar10);
        uVar8 = 0;
        uSet = 0;
        do {
          if ((char)*pbVar13 < '\0') goto LAB_006b8ce5;
          bVar6 = *pbVar13 >> 1;
          switch(uVar3 >> ((byte)uVar8 & 0x1f) & 3) {
          case 1:
            uSet = uSet | 1 << ((uint)bVar6 * 2 & 0x1f);
            break;
          case 2:
            __assert_fail("Value == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaIf.c"
                          ,0x594,
                          "int Gia_ManFromIfLogicFindLut(If_Man_t *, Gia_Man_t *, If_Cut_t *, sat_solver *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                         );
          case 3:
            uSet = uSet | 3 << (bVar6 * '\x02' & 0x1f);
          }
          uVar8 = uVar8 + 2;
          pbVar13 = pbVar13 + 1;
        } while (uVar12 * 2 != uVar8);
      }
      pwVar1 = pIfMan->puTempW;
      pVVar2 = pIfMan->vTtMem[uVar12];
      if (pVVar2 == (Vec_Mem_t *)0x0) {
        pwVar5 = (word *)0x0;
      }
      else {
        if (pVVar2->nEntries <= (int)uVar10) goto LAB_006b89ff;
        pwVar5 = pVVar2->ppPages[uVar10 >> ((byte)pVVar2->LogPageSze & 0x1f)] +
                 (ulong)(uVar10 & pVVar2->PageMask) * (long)pVVar2->nEntrySize;
      }
      uVar3 = pIfMan->nTruth6Words[uVar12];
      if ((uVar4 & 1) == 0) {
        if (0 < (int)uVar3) {
          uVar8 = 0;
          do {
            pwVar1[uVar8] = pwVar5[uVar8];
            uVar8 = uVar8 + 1;
          } while (uVar3 != uVar8);
        }
      }
      else if (0 < (int)uVar3) {
        uVar8 = 0;
        do {
          pwVar1[uVar8] = ~pwVar5[uVar8];
          uVar8 = uVar8 + 1;
        } while (uVar3 != uVar8);
      }
      iVar7 = If_ManSatCheckXY(pSat,iVar7,pwVar1,(uint)(byte)pCutBest->field_0x1f,uSet,&uBound,
                               &uFree,vLits);
      if (iVar7 == 0) {
        __assert_fail("RetValue",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaIf.c"
                      ,0x597,
                      "int Gia_ManFromIfLogicFindLut(If_Man_t *, Gia_Man_t *, If_Cut_t *, sat_solver *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                     );
      }
      uVar4 = *(uint *)&pCutBest->field_0x1c;
      uVar8 = 0;
      uVar3 = 0;
      uVar14 = 0;
      if (0xffffff < uVar4) {
        uVar9 = 0;
        uVar8 = 0;
        uVar3 = 0;
        uVar14 = 0;
        bVar6 = 0;
        uVar15 = uVar14;
        switch(uSet & 3) {
        case 1:
          goto switchD_006b89a0_caseD_1;
        case 2:
switchD_006b89a0_caseD_2:
          __assert_fail("Value == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaIf.c"
                        ,0x5a2,
                        "int Gia_ManFromIfLogicFindLut(If_Man_t *, Gia_Man_t *, If_Cut_t *, sat_solver *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                       );
        case 3:
          goto switchD_006b89a0_caseD_3;
        }
switchD_006b89a0_caseD_0:
        piVar11 = pVarsF;
        uVar14 = (ulong)((int)uVar15 + 1);
        do {
          piVar11[(int)uVar15] = uVar9;
          uVar9 = uVar9 + 1;
          if (uVar4 >> 0x18 == uVar9) break;
          bVar6 = bVar6 + 2;
          uVar15 = uVar14;
          switch(uSet >> (bVar6 & 0x1f) & 3) {
          case 0:
            goto switchD_006b89a0_caseD_0;
          case 1:
switchD_006b89a0_caseD_1:
            uVar15 = (ulong)uVar3;
            uVar3 = uVar3 + 1;
            piVar11 = pVarsB;
            break;
          case 2:
            goto switchD_006b89a0_caseD_2;
          case 3:
switchD_006b89a0_caseD_3:
            uVar15 = uVar8;
            piVar11 = pVarsS;
            uVar8 = (ulong)((int)uVar15 + 1);
          }
        } while( true );
      }
      vLits->nSize = 0;
      if (0 < (int)uVar8) {
        uVar15 = 0;
        do {
          iVar7 = pVarsS[uVar15];
          if (((long)iVar7 < 0) || (vLeaves->nSize <= iVar7)) goto LAB_006b8cc6;
          Vec_IntPush(vLits,vLeaves->pArray[iVar7]);
          uVar15 = uVar15 + 1;
        } while (uVar8 != uVar15);
      }
      if (0 < (int)uVar3) {
        uVar15 = 0;
        do {
          iVar7 = pVarsB[uVar15];
          if (((long)iVar7 < 0) || (vLeaves->nSize <= iVar7)) goto LAB_006b8cc6;
          Vec_IntPush(vLits,vLeaves->pArray[iVar7]);
          uVar15 = uVar15 + 1;
        } while (uVar3 != uVar15);
      }
      uVar4 = Gia_ManFromIfLogicCreateLut(pNew,&uBound,vLits,vCover,vMapping,vMapping2);
      vLits->nSize = 0;
      Vec_IntPush(vLits,uVar4);
      if (0 < (int)uVar8) {
        uVar15 = 0;
        do {
          iVar7 = pVarsS[uVar15];
          if (((long)iVar7 < 0) || (vLeaves->nSize <= iVar7)) goto LAB_006b8cc6;
          Vec_IntPush(vLits,vLeaves->pArray[iVar7]);
          uVar15 = uVar15 + 1;
        } while (uVar8 != uVar15);
      }
      if (0 < (int)uVar14) {
        uVar8 = 0;
        do {
          iVar7 = pVarsF[uVar8];
          if (((long)iVar7 < 0) || (vLeaves->nSize <= iVar7)) {
LAB_006b8cc6:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                          ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          Vec_IntPush(vLits,vLeaves->pArray[iVar7]);
          uVar8 = uVar8 + 1;
        } while (uVar14 != uVar8);
      }
      uVar3 = Gia_ManFromIfLogicCreateLut(pNew,&uFree,vLits,vCover,vMapping,vMapping2);
      Vec_IntPush(vPacking,2);
      if ((-1 < (int)uVar4) && (Vec_IntPush(vPacking,uVar4 >> 1), -1 < (int)uVar3)) {
        Vec_IntPush(vPacking,uVar3 >> 1);
        iVar7 = vPacking->nSize;
        goto joined_r0x006b8787;
      }
    }
  }
  else {
    uVar3 = pCutBest->iCutFunc;
    if ((int)uVar3 < 0) {
      __assert_fail("pCut->iCutFunc >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/if.h"
                    ,0x1aa,"word *If_CutTruthW(If_Man_t *, If_Cut_t *)");
    }
    pwVar1 = pIfMan->puTempW;
    pVVar2 = pIfMan->vTtMem[(byte)pCutBest->field_0x1f];
    if (pVVar2 == (Vec_Mem_t *)0x0) {
      pwVar5 = (word *)0x0;
    }
    else {
      uVar4 = uVar3 >> 1;
      if (pVVar2->nEntries <= (int)uVar4) {
LAB_006b89ff:
        __assert_fail("i >= 0 && i < p->nEntries",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecMem.h"
                      ,0xc9,"word *Vec_MemReadEntry(Vec_Mem_t *, int)");
      }
      pwVar5 = pVVar2->ppPages[uVar4 >> ((byte)pVVar2->LogPageSze & 0x1f)] +
               (ulong)(uVar4 & pVVar2->PageMask) * (long)pVVar2->nEntrySize;
    }
    uVar4 = pIfMan->nTruth6Words[(byte)pCutBest->field_0x1f];
    if ((uVar3 & 1) == 0) {
      if (0 < (int)uVar4) {
        uVar8 = 0;
        do {
          pwVar1[uVar8] = pwVar5[uVar8];
          uVar8 = uVar8 + 1;
        } while (uVar4 != uVar8);
      }
    }
    else if (0 < (int)uVar4) {
      uVar8 = 0;
      do {
        pwVar1[uVar8] = ~pwVar5[uVar8];
        uVar8 = uVar8 + 1;
      } while (uVar4 != uVar8);
    }
    uVar3 = Gia_ManFromIfLogicCreateLut(pNew,pwVar1,vLeaves,vCover,vMapping,vMapping2);
    if (-1 < (int)uVar3) {
      uVar4 = uVar3 >> 1;
      if (pNew->nObjs <= (int)uVar4) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if ((int)uVar3 < 2) {
        return uVar3;
      }
      if (((uint)*(undefined8 *)(pNew->pObjs + uVar4) & 0x9fffffff) == 0x9fffffff) {
        return uVar3;
      }
      Vec_IntPush(vPacking,1);
      Vec_IntPush(vPacking,uVar4);
      iVar7 = vPacking->nSize;
joined_r0x006b8787:
      if (0 < iVar7) {
        *vPacking->pArray = *vPacking->pArray + 1;
        return uVar3;
      }
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x1d1,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
    }
  }
LAB_006b8ce5:
  __assert_fail("Lit >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                ,0x10c,"int Abc_Lit2Var(int)");
}

Assistant:

int Gia_ManFromIfLogicFindLut( If_Man_t * pIfMan, Gia_Man_t * pNew, If_Cut_t * pCutBest, sat_solver * pSat, Vec_Int_t * vLeaves, Vec_Int_t * vLits, Vec_Int_t * vCover, Vec_Int_t * vMapping, Vec_Int_t * vMapping2, Vec_Int_t * vPacking )
{
    word uBound, uFree;
    int nLutSize = (int)(pIfMan->pPars->pLutStruct[0] - '0');
    int nVarsF = 0, pVarsF[IF_MAX_FUNC_LUTSIZE];
    int nVarsB = 0, pVarsB[IF_MAX_FUNC_LUTSIZE];
    int nVarsS = 0, pVarsS[IF_MAX_FUNC_LUTSIZE];
    unsigned uSetNew, uSetOld;
    int RetValue, RetValue2, k;
    char * pPerm;
    if ( Vec_IntSize(vLeaves) <= nLutSize )
    {
        RetValue = Gia_ManFromIfLogicCreateLut( pNew, If_CutTruthW(pIfMan, pCutBest), vLeaves, vCover, vMapping, vMapping2 );
        // write packing
        if ( !Gia_ObjIsCi(Gia_ManObj(pNew, Abc_Lit2Var(RetValue))) && RetValue > 1 )
        {
            Vec_IntPush( vPacking, 1 );
            Vec_IntPush( vPacking, Abc_Lit2Var(RetValue) );
            Vec_IntAddToEntry( vPacking, 0, 1 );
        }
        return RetValue;
    }
    assert( If_DsdManSuppSize(pIfMan->pIfDsdMan, If_CutDsdLit(pIfMan, pCutBest)) == (int)pCutBest->nLeaves );
    // find the bound set
    if ( pIfMan->pPars->fDelayOptLut )
        uSetOld = pCutBest->uMaskFunc;
    else
        uSetOld = If_DsdManCheckXY( pIfMan->pIfDsdMan, If_CutDsdLit(pIfMan, pCutBest), nLutSize, 1, 0, 1, 0 );
    // remap bound set
    uSetNew = 0;
    pPerm = If_CutDsdPerm( pIfMan, pCutBest );
    for ( k = 0; k < If_CutLeaveNum(pCutBest); k++ )
    {
        int iVar = Abc_Lit2Var((int)pPerm[k]);
        int Value = ((uSetOld >> (k << 1)) & 3);
        if ( Value == 1 )
            uSetNew |= (1 << (2*iVar));
        else if ( Value == 3 )
            uSetNew |= (3 << (2*iVar));
        else assert( Value == 0 );
    }
    RetValue = If_ManSatCheckXY( pSat, nLutSize, If_CutTruthW(pIfMan, pCutBest), pCutBest->nLeaves, uSetNew, &uBound, &uFree, vLits );
    assert( RetValue );
    // collect variables
    for ( k = 0; k < If_CutLeaveNum(pCutBest); k++ )
    {
        int Value = ((uSetNew >> (k << 1)) & 3);
        if ( Value == 0 )
            pVarsF[nVarsF++] = k;
        else if ( Value == 1 )
            pVarsB[nVarsB++] = k;
        else if ( Value == 3 )
            pVarsS[nVarsS++] = k;
        else assert( Value == 0 );
    }
    // collect bound set variables
    Vec_IntClear( vLits );
    for ( k = 0; k < nVarsS; k++ )
        Vec_IntPush( vLits, Vec_IntEntry(vLeaves, pVarsS[k]) );
    for ( k = 0; k < nVarsB; k++ )
        Vec_IntPush( vLits, Vec_IntEntry(vLeaves, pVarsB[k]) );
    RetValue = Gia_ManFromIfLogicCreateLut( pNew, &uBound, vLits, vCover, vMapping, vMapping2 );
    // collecct free set variables
    Vec_IntClear( vLits );
    Vec_IntPush( vLits, RetValue );
    for ( k = 0; k < nVarsS; k++ )
        Vec_IntPush( vLits, Vec_IntEntry(vLeaves, pVarsS[k]) );
    for ( k = 0; k < nVarsF; k++ )
        Vec_IntPush( vLits, Vec_IntEntry(vLeaves, pVarsF[k]) );
    // add packing
    RetValue2 = Gia_ManFromIfLogicCreateLut( pNew, &uFree, vLits, vCover, vMapping, vMapping2 );
    // write packing
    Vec_IntPush( vPacking, 2 );
    Vec_IntPush( vPacking, Abc_Lit2Var(RetValue) );
    Vec_IntPush( vPacking, Abc_Lit2Var(RetValue2) );
    Vec_IntAddToEntry( vPacking, 0, 1 );
    return RetValue2;
}